

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

Pair * __thiscall camp::Enum::pair(Enum *this,size_t index)

{
  random_access_index_node_impl<std::allocator<char>_> *prVar1;
  Pair *pPVar2;
  OutOfRange *__return_storage_ptr__;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  OutOfRange local_68;
  
  if (index < (this->m_pairs).node_count) {
    prVar1 = (this->m_pairs).super_type.ptrs.spc.data_[index];
    pPVar2 = (Pair *)(prVar1 + -0xb);
    if (prVar1 == (random_access_index_node_impl<std::allocator<char>_> *)0x0) {
      pPVar2 = (Pair *)0x0;
    }
    return pPVar2;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange(&local_68,index,(this->m_pairs).node_count);
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enum.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"const Enum::Pair &camp::Enum::pair(std::size_t) const",&local_aa);
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_68,&local_88,0x38,&local_a8);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Enum::Pair& Enum::pair(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_pairs.size())
        CAMP_ERROR(OutOfRange(index, m_pairs.size()));

    return m_pairs[index];
}